

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float128 float128_mul_m68k(float128 a,float128 b,float_status *status)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  byte zSign;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint64_t uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  int32_t zExp;
  float128 fVar21;
  int32_t aExp;
  int32_t bExp;
  uint32_t aLow;
  uint64_t aSig1;
  uint local_a4;
  ulong local_a0;
  long local_98;
  float_status *local_90;
  uint local_84;
  ulong local_80;
  ulong local_78;
  uint64_t local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  uint64_t local_40;
  ulong local_38;
  
  uVar6 = b.low;
  local_70 = a.low;
  local_68 = a.high & 0xffffffffffff;
  local_a4 = a.high._6_2_ & 0x7fff;
  uVar15 = b.high & 0xffffffffffff;
  uVar20 = b.high._6_2_ & 0x7fff;
  uVar17 = b.high ^ a.high;
  local_84 = uVar20;
  local_40 = uVar6;
  local_38 = uVar15;
  if (local_a4 == 0x7fff) {
    if ((((undefined1  [16])a & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
         local_70 != 0) ||
       ((((undefined1  [16])b & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
        uVar6 != 0) && uVar20 == 0x7fff)) {
LAB_006cb63f:
      fVar21 = propagateFloat128NaN(a,b,status);
      return fVar21;
    }
    if ((((undefined1  [16])b & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0 &&
        uVar6 == 0) &&
        ((undefined1  [16])b & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0) {
LAB_006cb698:
      status->float_exception_flags = status->float_exception_flags | 1;
      fVar21.high = 0x7fffffffffffffff;
      fVar21.low = 0xffffffffffffffff;
      return fVar21;
    }
LAB_006cb610:
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar17 & 0x8000000000000000 | 0x7fff000000000000;
    return (float128)(auVar1 << 0x40);
  }
  if (uVar20 == 0x7fff) {
    if (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
        uVar6 != 0) goto LAB_006cb63f;
    if ((((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0 &&
        local_70 == 0) &&
        ((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0)
    goto LAB_006cb698;
    goto LAB_006cb610;
  }
  if (((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
    if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
        local_70 == 0) goto LAB_006cb8ff;
    normalizeFloat128Subnormal(local_68,local_70,(int32_t *)&local_a4,&local_68,&local_70);
  }
  local_90 = status;
  if (((undefined1  [16])b & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
    if (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
        uVar6 == 0) {
LAB_006cb8ff:
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar17 & 0x8000000000000000;
      return (float128)(auVar2 << 0x40);
    }
    normalizeFloat128Subnormal(uVar15,uVar6,(int32_t *)&local_84,&local_38,&local_40);
    uVar15 = local_38;
    uVar6 = local_40;
    uVar20 = local_84;
  }
  uVar15 = uVar15 << 0x10;
  uVar16 = uVar15 | uVar6 >> 0x30;
  uVar9 = local_68 | 0x1000000000000;
  uVar19 = uVar6 * 0x10000;
  uVar12 = local_70 >> 0x20;
  local_50 = uVar19 >> 0x20;
  local_80 = local_70;
  uVar4 = (local_70 & 0xffffffff) * local_50;
  uVar7 = uVar12 * (uVar19 & 0xffffffff);
  uVar8 = uVar7 + uVar4;
  local_78 = local_70 * uVar19;
  uVar5 = uVar15 >> 0x20;
  uVar3 = (local_70 & 0xffffffff) * uVar5;
  uVar11 = uVar15 & 0xffffffff | uVar6 >> 0x30;
  uVar10 = uVar12 * uVar11;
  uVar15 = uVar10 + uVar3;
  local_60 = uVar15 >> 0x20;
  uVar18 = local_70 * uVar16;
  local_58 = (ulong)(uVar18 < uVar15 << 0x20);
  uVar13 = uVar12 * local_50 + uVar18 + (uVar8 >> 0x20) + ((ulong)CARRY8(uVar7,uVar4) << 0x20) +
           (ulong)(local_78 < uVar8 << 0x20);
  uVar14 = uVar9 >> 0x20;
  uVar15 = uVar5 * (local_68 & 0xffffffff);
  uVar11 = uVar11 * uVar14;
  uVar7 = uVar11 + uVar15;
  local_98 = (ulong)CARRY8(uVar11,uVar15) << 0x20;
  uVar16 = uVar16 * uVar9;
  local_a0 = (ulong)(uVar16 < uVar7 << 0x20);
  uVar8 = uVar12 * uVar5 + uVar16 + local_60 + ((ulong)CARRY8(uVar10,uVar3) << 0x20) + local_58 +
          (ulong)(uVar13 < uVar18);
  uVar15 = (local_68 & 0xffffffff) * local_50;
  uVar3 = (uVar19 & 0xffffffff) * uVar14;
  uVar4 = uVar3 + uVar15;
  uVar19 = uVar19 * uVar9;
  uVar3 = (uVar4 >> 0x20) + uVar14 * local_50 + ((ulong)CARRY8(uVar3,uVar15) << 0x20) +
          (ulong)(uVar19 < uVar4 << 0x20) + (ulong)CARRY8(uVar19,uVar13);
  uVar4 = uVar3 + uVar8;
  uVar15 = uVar4 + local_70;
  uVar6 = uVar5 * uVar14 + uVar9 + (uVar7 >> 0x20) + local_98 + local_a0 + (ulong)(uVar8 < uVar16) +
          (ulong)CARRY8(uVar3,uVar8) + (ulong)CARRY8(uVar4,local_70);
  uVar3 = (ulong)(local_78 != 0) | uVar19 + uVar13;
  if (uVar6 >> 0x31 == 0) {
    zExp = uVar20 + local_a4 + -0x4000;
  }
  else {
    uVar4 = uVar6 << 0x3f;
    uVar6 = uVar6 >> 1;
    uVar3 = (ulong)(uVar3 != 0) | uVar15 << 0x3f;
    zExp = uVar20 + local_a4 + -0x3fff;
    uVar15 = uVar4 | uVar15 >> 1;
  }
  local_48._0_1_ = (byte)(uVar17 >> 0x3f);
  zSign = (byte)local_48;
  local_48 = uVar17 >> 0x3f;
  fVar21 = roundAndPackFloat128(zSign,zExp,uVar6,uVar15,uVar3,local_90);
  return fVar21;
}

Assistant:

float128 float128_mul(float128 a, float128 b, float_status *status)
{
    flag aSign, bSign, zSign;
    int32_t aExp, bExp, zExp;
    uint64_t aSig0, aSig1, bSig0, bSig1, zSig0, zSig1, zSig2, zSig3;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    bSig1 = extractFloat128Frac1( b );
    bSig0 = extractFloat128Frac0( b );
    bExp = extractFloat128Exp( b );
    bSign = extractFloat128Sign( b );
    zSign = aSign ^ bSign;
    if ( aExp == 0x7FFF ) {
        if (    ( aSig0 | aSig1 )
             || ( ( bExp == 0x7FFF ) && ( bSig0 | bSig1 ) ) ) {
            return propagateFloat128NaN(a, b, status);
        }
        if ( ( bExp | bSig0 | bSig1 ) == 0 ) goto invalid;
        return packFloat128( zSign, 0x7FFF, 0, 0 );
    }
    if ( bExp == 0x7FFF ) {
        if (bSig0 | bSig1) {
            return propagateFloat128NaN(a, b, status);
        }
        if ( ( aExp | aSig0 | aSig1 ) == 0 ) {
 invalid:
            float_raise(float_flag_invalid, status);
            return float128_default_nan(status);
        }
        return packFloat128( zSign, 0x7FFF, 0, 0 );
    }
    if ( aExp == 0 ) {
        if ( ( aSig0 | aSig1 ) == 0 ) return packFloat128( zSign, 0, 0, 0 );
        normalizeFloat128Subnormal( aSig0, aSig1, &aExp, &aSig0, &aSig1 );
    }
    if ( bExp == 0 ) {
        if ( ( bSig0 | bSig1 ) == 0 ) return packFloat128( zSign, 0, 0, 0 );
        normalizeFloat128Subnormal( bSig0, bSig1, &bExp, &bSig0, &bSig1 );
    }
    zExp = aExp + bExp - 0x4000;
    aSig0 |= UINT64_C(0x0001000000000000);
    shortShift128Left( bSig0, bSig1, 16, &bSig0, &bSig1 );
    mul128To256( aSig0, aSig1, bSig0, bSig1, &zSig0, &zSig1, &zSig2, &zSig3 );
    add128( zSig0, zSig1, aSig0, aSig1, &zSig0, &zSig1 );
    zSig2 |= ( zSig3 != 0 );
    if (UINT64_C( 0x0002000000000000) <= zSig0 ) {
        shift128ExtraRightJamming(
            zSig0, zSig1, zSig2, 1, &zSig0, &zSig1, &zSig2 );
        ++zExp;
    }
    return roundAndPackFloat128(zSign, zExp, zSig0, zSig1, zSig2, status);

}